

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O1

void __thiscall
libtorrent::resolver::async_resolve(resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  char *__s;
  long lVar1;
  long lVar2;
  io_service *piVar3;
  bool bVar4;
  string *host_00;
  resolver *prVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint *puVar9;
  char *pcVar10;
  iterator iVar11;
  time_point tVar12;
  long *plVar13;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar14;
  undefined7 in_register_00000011;
  in_addr_t iVar15;
  char *__cp;
  ulong uVar16;
  undefined8 uVar17;
  pointer pcVar18;
  anon_enum_32 aVar19;
  uint uVar20;
  size_t __n;
  bool bVar21;
  bool bVar22;
  bytes_type bytes;
  query q;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  undefined1 local_148 [8];
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Any_data local_118;
  _Manager_type local_108;
  _Head_base<0UL,_libtorrent::resolver_*,_false> local_f8;
  string *local_f0;
  uint local_e4;
  resolver *local_e0;
  undefined1 local_d8 [8];
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  fStack_d0;
  addrinfo *local_b0;
  _Alloc_hider _Stack_a8;
  undefined1 local_a0 [24];
  _Alloc_hider local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  resolver *local_68;
  void *pvStack_60;
  uint *local_50;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_48;
  
  local_e4 = (uint)CONCAT71(in_register_00000011,flags.m_val);
  __s = (host->_M_dataplus)._M_p;
  local_e0 = this;
  puVar9 = (uint *)__errno_location();
  *puVar9 = 0;
  pcVar10 = strchr(__s,0x25);
  __cp = __s;
  local_f0 = host;
  local_50 = puVar9;
  if (pcVar10 != (char *)0x0) {
    __n = (long)pcVar10 - (long)__s;
    if (0x3f < (long)__n) {
      pcVar18 = (pointer)0x0;
      bVar21 = true;
      uVar20 = 0x16;
      iVar8 = 0;
      goto LAB_00248e95;
    }
    __cp = local_d8;
    memcpy(__cp,__s,__n);
    local_d8[__n] = 0;
  }
  iVar8 = inet_pton(10,__cp,local_148);
  bVar21 = *puVar9 != 0;
  uVar20 = 0x16;
  if (iVar8 >= 1 || bVar21) {
    uVar20 = *puVar9;
  }
  bVar21 = iVar8 < 1 && !bVar21 || bVar21;
  if ((iVar8 < 1) || (pcVar10 == (char *)0x0)) {
    pcVar18 = (pointer)0x0;
  }
  else {
    if (((local_148[1] & 0xc0) == 0x80 && local_148[0] == (string)0xfe) ||
       ((local_148[1] & 0xf) == 2 && local_148[0] == (string)0xff)) {
      uVar6 = if_nametoindex(pcVar10 + 1);
      pcVar18 = (pointer)(ulong)uVar6;
    }
    else {
      pcVar18 = (pointer)0x0;
    }
    if (pcVar18 == (pointer)0x0) {
      iVar7 = atoi(pcVar10 + 1);
      pcVar18 = (pointer)(long)iVar7;
    }
  }
LAB_00248e95:
  puVar9 = local_50;
  if (iVar8 < 1) {
    local_d8 = (undefined1  [8])0x0;
    fStack_d0.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    pcVar18 = (pointer)0x0;
  }
  else {
    local_d8 = local_148;
    fStack_d0.super__Function_base._M_functor._M_unused._M_object = pcStack_140;
  }
  if (bVar21) {
    *local_50 = 0;
    iVar8 = inet_pton(2,__s,local_148);
    bVar22 = *puVar9 != 0;
    bVar4 = iVar8 < 1;
    uVar20 = 0x16;
    if (!bVar4 || bVar22) {
      uVar20 = *puVar9;
    }
    bVar21 = bVar4 && !bVar22 || bVar22;
    if (bVar4 && !bVar22 || bVar22) {
      iVar15 = 0;
    }
    else {
      iVar15 = local_148._0_4_;
      if (iVar8 < 1) {
        iVar15 = 0;
      }
    }
    pvStack_60 = (void *)0x0;
    local_68 = (resolver *)0x0;
    pcVar18 = (pointer)0x0;
    aVar19 = ipv4;
  }
  else {
    local_68 = (resolver *)local_d8;
    pvStack_60 = fStack_d0.super__Function_base._M_functor._M_unused._M_object;
    aVar19 = ipv6;
    iVar15 = 0;
  }
  prVar5 = local_e0;
  host_00 = local_f0;
  if (bVar21) {
    iVar11 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(local_e0->m_cache)._M_h,local_f0);
    uVar20 = local_e4;
    if ((iVar11.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
         ._M_cur == (__node_type *)0x0) ||
       (((local_e4 & 1) == 0 &&
        (lVar1 = (prVar5->m_timeout).__r,
        lVar2 = *(long *)((long)iVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                                ._M_cur + 0x28), tVar12 = aux::time_now(),
        lVar1 + lVar2 < (long)tVar12.__d.__r)))) {
      if ((uVar20 & 1) != 0) {
        piVar3 = prVar5->m_ios;
        local_d8 = (undefined1  [8])prVar5;
        std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function(&fStack_d0,h);
        local_148 = (undefined1  [8])local_d8;
        plVar13 = (long *)__tls_get_addr(&PTR_0046df10);
        if (*plVar13 == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = *(undefined8 *)(*plVar13 + 8);
        }
        pcVar14 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)boost::asio::detail::thread_info_base::
                     allocate<boost::asio::detail::thread_info_base::default_tag>(uVar17,0x48);
        aStack_138._M_allocated_capacity = 0;
        (pcVar14->super_operation).next_ = (scheduler_operation *)0x0;
        (pcVar14->super_operation).func_ =
             boost::asio::detail::
             completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
             ::do_complete;
        (pcVar14->super_operation).task_result_ = 0;
        (pcVar14->handler_).this = (resolver *)local_d8;
        pcStack_140 = pcVar14;
        std::
        function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
        ::function(&(pcVar14->handler_).h,&fStack_d0);
        aStack_138._M_allocated_capacity = (size_type)pcVar14;
        boost::asio::detail::scheduler::post_immediate_completion
                  (piVar3->impl_,(operation *)pcVar14,false);
        pcStack_140 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                       *)0x0;
        aStack_138._M_allocated_capacity = 0;
        boost::asio::detail::
        completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
        ::ptr::reset((ptr *)local_148);
        if ((sockaddr *)fStack_d0.super__Function_base._M_manager == (sockaddr *)0x0) {
          return;
        }
        (*fStack_d0.super__Function_base._M_manager)(&fStack_d0,&fStack_d0,3);
        return;
      }
      local_148 = (undefined1  [8])&aStack_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"80","");
      boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
                ((basic_resolver_query<boost::asio::ip::tcp> *)local_d8,host_00,(string *)local_148,
                 address_configured);
      if (local_148 != (undefined1  [8])&aStack_138) {
        operator_delete((void *)local_148,aStack_138._M_allocated_capacity + 1);
      }
      if ((uVar20 & 2) == 0) {
        local_148 = (undefined1  [8])on_lookup;
        pcStack_140 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                       *)0x0;
        std::
        _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&aStack_138,h,host_00);
        local_f8._M_head_impl = prVar5;
        boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
        async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  ((prVar5->m_critical_resolver).impl_.service_,
                   &(prVar5->m_critical_resolver).impl_.implementation_,(query_type *)local_d8,
                   (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_148,&(prVar5->m_critical_resolver).impl_.executor_);
        if (local_108 != (_Manager_type)0x0) {
          (*local_108)(&local_118,&local_118,__destroy_functor);
        }
      }
      else {
        local_148 = (undefined1  [8])on_lookup;
        pcStack_140 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                       *)0x0;
        std::
        _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&aStack_138,h,host_00);
        local_f8._M_head_impl = prVar5;
        boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
        async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                  ((prVar5->m_resolver).impl_.service_,&(prVar5->m_resolver).impl_.implementation_,
                   (query_type *)local_d8,
                   (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)local_148,&(prVar5->m_resolver).impl_.executor_);
        if (local_108 != (_Manager_type)0x0) {
          (*local_108)(&local_118,&local_118,__destroy_functor);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_138._M_allocated_capacity != &local_128) {
        operator_delete((void *)aStack_138._M_allocated_capacity,local_128._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((system_error_category *)_Stack_a8._M_p == (system_error_category *)(local_a0 + 8)) {
        return;
      }
      uVar16 = local_a0._8_8_ + 1;
      local_48.
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)_Stack_a8._M_p;
    }
    else {
      std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                (&local_48,
                 (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                 ((long)iVar11.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                        ._M_cur + 0x30));
      piVar3 = prVar5->m_ios;
      local_d8 = (undefined1  [8])prVar5;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function(&fStack_d0,h);
      local_b0 = (addrinfo *)0x0;
      _Stack_a8._M_p = (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
      std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
                ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
                 local_a0,&local_48);
      local_148 = (undefined1  [8])local_d8;
      plVar13 = (long *)__tls_get_addr(&PTR_0046df10);
      if (*plVar13 == 0) {
        uVar17 = 0;
      }
      else {
        uVar17 = *(undefined8 *)(*plVar13 + 8);
      }
      pcVar14 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar17,0x70);
      aStack_138._M_allocated_capacity = 0;
      (pcVar14->super_operation).next_ = (scheduler_operation *)0x0;
      (pcVar14->super_operation).func_ =
           boost::asio::detail::
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
           ::do_complete;
      (pcVar14->super_operation).task_result_ = 0;
      (pcVar14->handler_).this = (resolver *)local_d8;
      pcStack_140 = pcVar14;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function(&(pcVar14->handler_).h,&fStack_d0);
      *(addrinfo **)&(pcVar14->handler_).ec = local_b0;
      (pcVar14->handler_).ec.cat_ = (error_category *)_Stack_a8._M_p;
      (pcVar14->handler_).ip.type_ = local_a0._0_4_;
      (pcVar14->handler_).ip.ipv4_address_ = (address_v4)local_a0._4_4_;
      *(undefined8 *)&(pcVar14->handler_).ip.ipv6_address_.addr_.__in6_u = local_a0._8_8_;
      *(undefined8 *)((long)&(pcVar14->handler_).ip.ipv6_address_.addr_.__in6_u + 8) =
           local_a0._16_8_;
      local_a0._0_8_ = (pointer)0x0;
      local_a0._8_8_ = 0;
      local_a0._16_8_ = 0;
      aStack_138._M_allocated_capacity = (size_type)pcVar14;
      boost::asio::detail::scheduler::post_immediate_completion
                (piVar3->impl_,(operation *)pcVar14,false);
      pcStack_140 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                     *)0x0;
      aStack_138._M_allocated_capacity = 0;
      boost::asio::detail::
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
      ::ptr::reset((ptr *)local_148);
      if ((pointer)local_a0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ - local_a0._0_8_);
      }
      if ((sockaddr *)fStack_d0.super__Function_base._M_manager != (sockaddr *)0x0) {
        (*fStack_d0.super__Function_base._M_manager)(&fStack_d0,&fStack_d0,3);
      }
      if (local_48.
          super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
          _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      uVar16 = (long)local_48.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_48.
                     super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    operator_delete(local_48.
                    super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                    ._M_impl.super__Vector_impl_data._M_start,uVar16);
    return;
  }
  local_f0 = (string *)local_e0->m_ios;
  local_d8 = (undefined1  [8])local_e0;
  std::
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::function(&fStack_d0,h);
  local_b0 = (addrinfo *)(ulong)uVar20;
  _Stack_a8._M_p = (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
  local_a0._8_8_ = local_68;
  local_a0._16_8_ = pvStack_60;
  local_148 = (undefined1  [8])local_d8;
  local_88._M_p = pcVar18;
  local_a0._0_4_ = aVar19;
  local_a0._4_4_ = iVar15;
  plVar13 = (long *)__tls_get_addr(&PTR_0046df10);
  if (*plVar13 == 0) {
    uVar17 = 0;
  }
  else {
    uVar17 = *(undefined8 *)(*plVar13 + 8);
  }
  pcVar14 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
             *)boost::asio::detail::thread_info_base::
               allocate<boost::asio::detail::thread_info_base::default_tag>(uVar17,0x78);
  aStack_138._M_allocated_capacity = 0;
  (pcVar14->super_operation).next_ = (scheduler_operation *)0x0;
  (pcVar14->super_operation).func_ =
       boost::asio::detail::
       completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
       ::do_complete;
  (pcVar14->super_operation).task_result_ = 0;
  (pcVar14->handler_).this = (resolver *)local_d8;
  pcStack_140 = pcVar14;
  std::
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  ::function(&(pcVar14->handler_).h,&fStack_d0);
  *(addrinfo **)&(pcVar14->handler_).ec = local_b0;
  (pcVar14->handler_).ec.cat_ = (error_category *)_Stack_a8._M_p;
  (pcVar14->handler_).ip.type_ = local_a0._0_4_;
  (pcVar14->handler_).ip.ipv4_address_.addr_.s_addr = local_a0._4_4_;
  *(undefined8 *)&(pcVar14->handler_).ip.ipv6_address_.addr_.__in6_u = local_a0._8_8_;
  *(undefined8 *)((long)&(pcVar14->handler_).ip.ipv6_address_.addr_.__in6_u + 8) = local_a0._16_8_;
  (pcVar14->handler_).ip.ipv6_address_.scope_id_ = (unsigned_long)local_88._M_p;
  aStack_138._M_allocated_capacity = (size_type)pcVar14;
  boost::asio::detail::scheduler::post_immediate_completion
            ((scheduler *)local_f0->_M_string_length,(operation *)pcVar14,false);
  pcStack_140 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)0x0;
  aStack_138._M_allocated_capacity = 0;
  boost::asio::detail::
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  ::ptr::reset((ptr *)local_148);
  if ((sockaddr *)fStack_d0.super__Function_base._M_manager == (sockaddr *)0x0) {
    return;
  }
  (*fStack_d0.super__Function_base._M_manager)(&fStack_d0,&fStack_d0,3);
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t const& h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			m_ios.post([=]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= aux::time_now())
			{
				std::vector<address> ips = i->second.addresses;
				m_ios.post([=] { callback(h, ec, ips); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			m_ios.post([=] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		// the port is ignored
		tcp::resolver::query const q(host, "80");

		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
		else
		{
			m_critical_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
	}